

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

LoopHeader * __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,
          bool doProfileLoopCheck,bool isFirstIteration)

{
  FunctionBody *this_00;
  code *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  RegSlot localRegisterID;
  RegSlot localRegisterID_00;
  RegSlot localRegisterID_01;
  RegSlot RVar7;
  uint uVar8;
  uint uVar9;
  RegSlot RVar10;
  undefined4 *puVar11;
  LoopHeader *this_01;
  LoopEntryPointInfo *this_02;
  ThreadContext *this_03;
  undefined4 extraout_var;
  Var pvVar12;
  uint *puVar13;
  FunctionBody *pFVar14;
  ScriptConfiguration *this_04;
  NativeCodeGenerator *pNVar15;
  uint local_a8;
  uint loopInterpretCount;
  OpLayoutType local_a0;
  uint byteCodeSize;
  RegSlot local_98;
  uint local_94;
  RegSlot reg;
  uint32 i_1;
  AutoRestoreLoopNumbers autoRestore_1;
  undefined1 local_70 [8];
  AutoRestoreLoopNumbers autoRestore;
  uint local_58;
  uint newOffset;
  uint32 i;
  uint32 innerScopeCount;
  RegSlot paramClosureReg;
  RegSlot localFrameDisplayReg;
  RegSlot localClosureReg;
  RegSlot envReg;
  LoopEntryPointInfo *entryPointInfo;
  LoopHeader *loopHeader;
  FunctionBody *fn;
  bool isFirstIteration_local;
  bool doProfileLoopCheck_local;
  LayoutSize layoutSize_local;
  uint32 loopNumber_local;
  InterpreterStackFrame *this_local;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  uVar5 = FunctionBody::GetLoopCount(this_00);
  if (uVar5 <= loopNumber) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a3,"(loopNumber < fn->GetLoopCount())",
                                "loopNumber < fn->GetLoopCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar3 = IsInCatchOrFinallyBlock(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x17a4,"(!this->IsInCatchOrFinallyBlock())",
                                "!this->IsInCatchOrFinallyBlock()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  this_01 = FunctionBody::GetLoopHeader(this_00,loopNumber);
  bVar3 = TestFlags(this,1);
  this_01->isInTry = bVar3;
  bVar3 = TestFlags(this,0x100);
  this_01->isInTryFinally = bVar3;
  this_02 = LoopHeader::GetCurrentEntryPointInfo(this_01);
  bVar3 = FunctionBody::ForceJITLoopBody(this_00);
  if ((((bVar3) && (this_01->interpretCount == 0)) && ((this_01->hasYield & 1U) == 0)) &&
     ((this_02 != (LoopEntryPointInfo *)0x0 &&
      (bVar3 = EntryPointInfo::IsNotScheduled(&this_02->super_EntryPointInfo), bVar3)))) {
    pFVar14 = GetFunctionBody(this);
    bVar3 = DynamicProfileInfo::EnableImplicitCallFlags(pFVar14);
    if (bVar3) {
      this_03 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
      ThreadContext::AddImplicitCallFlags
                (this_03,*(ImplicitCallFlags *)(*(long *)(this + 0xc0) + (ulong)loopNumber));
    }
    pNVar15 = ScriptContext::GetNativeCodeGenerator(*(ScriptContext **)(this + 0x78));
    RVar10 = FunctionBody::GetLocalsCount(this_00);
    GenerateLoopBody(pNVar15,this_00,this_01,&this_02->super_EntryPointInfo,RVar10,
                     (Var *)(this + 0x160));
  }
  if ((this_02 != (LoopEntryPointInfo *)0x0) &&
     (bVar3 = EntryPointInfo::IsCodeGenDone(&this_02->super_EntryPointInfo), bVar3)) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01ec1678,JITLoopBodyPhase);
    if ((bVar3) && ((DAT_01ec73ca & 1) != 0)) {
      FunctionBody::DumpFunctionId(this_00,true);
      iVar6 = (*(this_00->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L": %-20s LoopBody Execute  Loop: %2d\n",CONCAT44(extraout_var,iVar6),
                    (ulong)loopNumber);
      Output::Flush();
    }
    this_01->nativeCount = this_01->nativeCount + 1;
    LoopEntryPointInfo::MarkAsUsed(this_02);
    EntryPointInfo::EnsureIsReadyToCall(&this_02->super_EntryPointInfo);
    EntryPointInfo::SetNativeEntryPointProcessed(&this_02->super_EntryPointInfo);
    RVar10 = FunctionBody::GetEnvRegister(*(FunctionBody **)(this + 0x88));
    if (RVar10 != 0xffffffff) {
      pvVar12 = LdEnv(this);
      SetNonVarReg(this,RVar10,pvVar12);
    }
    localRegisterID = FunctionBody::GetLocalClosureRegister(*(FunctionBody **)(this + 0x88));
    localRegisterID_00 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88))
    ;
    localRegisterID_01 = FunctionBody::GetParamClosureRegister(*(FunctionBody **)(this + 0x88));
    bVar3 = EntryPointInfo::HasJittedStackClosure(&this_02->super_EntryPointInfo);
    if (bVar3) {
      if (localRegisterID != 0xffffffff) {
        SetNonVarReg(this,localRegisterID,this + 0x58);
      }
      if (localRegisterID_00 != 0xffffffff) {
        SetNonVarReg(this,localRegisterID_00,this + 0x50);
      }
      if (localRegisterID_01 != 0xffffffff) {
        SetNonVarReg(this,localRegisterID_01,this + 0x60);
      }
    }
    else {
      if (localRegisterID != 0xffffffff) {
        SetNonVarReg(this,localRegisterID,*(Var *)(this + 0x58));
      }
      if (localRegisterID_00 != 0xffffffff) {
        SetNonVarReg(this,localRegisterID_00,*(Var *)(this + 0x50));
      }
      if (localRegisterID_01 != 0xffffffff) {
        SetNonVarReg(this,localRegisterID_01,*(Var *)(this + 0x60));
      }
    }
    uVar5 = FunctionBody::GetInnerScopeCount(*(FunctionBody **)(this + 0x88));
    for (local_58 = 0; local_58 < uVar5; local_58 = local_58 + 1) {
      RVar7 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
      pvVar12 = InnerScopeFromIndex(this,local_58);
      SetNonVarReg(this,RVar7 + local_58,pvVar12);
    }
    autoRestore.doProfileLoopCheck = false;
    autoRestore._13_3_ = 0;
    bVar3 = FunctionBody::GetIsAsmJsFunction(this_00);
    if (bVar3) {
      DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
      AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
                (local_70,this,loopNumber,doProfileLoopCheck);
      autoRestore._12_4_ =
           CallAsmJsLoopBody(this,(JavascriptMethod)
                                  (this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod
                            );
      DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
                ((AutoRestoreLoopNumbers *)local_70);
    }
    else {
      DoLoopBodyStart(unsigned_int,Js::LayoutSize,bool,bool)::AutoRestoreLoopNumbers::
      AutoRestoreLoopNumbers(Js::InterpreterStackFrame__unsigned_int_bool_
                (&reg,this,loopNumber,doProfileLoopCheck);
      autoRestore._12_4_ =
           CallLoopBody(this,(JavascriptMethod)
                             (this_02->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod);
      DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
                ((AutoRestoreLoopNumbers *)&reg);
    }
    if (RVar10 != 0xffffffff) {
      SetNonVarReg(this,RVar10,(Var)0x0);
    }
    if (localRegisterID != 0xffffffff) {
      SetNonVarReg(this,localRegisterID,(Var)0x0);
    }
    if (localRegisterID_00 != 0xffffffff) {
      SetNonVarReg(this,localRegisterID_00,(Var)0x0);
    }
    if (localRegisterID_01 != 0xffffffff) {
      SetNonVarReg(this,localRegisterID_01,(Var)0x0);
    }
    for (local_94 = 0; local_94 < uVar5; local_94 = local_94 + 1) {
      local_98 = FunctionBody::GetFirstInnerScopeRegister(*(FunctionBody **)(this + 0x88));
      uVar9 = local_94;
      local_98 = local_98 + local_94;
      pvVar12 = GetNonVarReg(this,local_98);
      SetInnerScopeFromIndex(this,uVar9,pvVar12);
      SetNonVarReg(this,local_98,(Var)0x0);
    }
    byteCodeSize = (uint)OpCodeUtil::GetOpCodeLayout(ProfiledLoopBodyStart);
    bVar3 = OpLayoutType::operator==((OpLayoutType *)&byteCodeSize,Unsigned1);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1833,
                                  "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                  ,
                                  "Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    local_a0 = OpCodeUtil::GetOpCodeLayout(LoopBodyStart);
    bVar3 = OpLayoutType::operator==(&local_a0,Unsigned1);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1834,
                                  "(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1)"
                                  ,
                                  "Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    uVar5 = OpCodeUtil::EncodedSize(LoopBodyStart,layoutSize);
    uVar8 = OpCodeUtil::EncodedSize(ProfiledLoopBodyStart,layoutSize);
    if (uVar5 != uVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1835,
                                  "(Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize) == Js::OpCodeUtil::EncodedSize(Js::OpCode::ProfiledLoopBodyStart, layoutSize))"
                                  ,
                                  "Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize) == Js::OpCodeUtil::EncodedSize(Js::OpCode::ProfiledLoopBodyStart, layoutSize)"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    uVar5 = OpCodeUtil::EncodedSize(LoopBodyStart,layoutSize);
    uVar2 = autoRestore._12_4_;
    if (layoutSize == SmallLayout) {
      loopInterpretCount = uVar5 + 1;
    }
    else if (layoutSize == MediumLayout) {
      loopInterpretCount = uVar5 + 2;
    }
    else {
      loopInterpretCount = uVar5 + 4;
    }
    if ((autoRestore._12_4_ != this_01->startOffset) &&
       (uVar5 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this),
       uVar2 != uVar5 - loopInterpretCount)) {
      CheckIfLoopIsHot(this,this_01->profiledLoopCounter);
      if (this_01->endOffset <= (uint)autoRestore._12_4_) {
        uVar9 = DAT_01ebb8b4 & 0xff;
        bVar4 = LoopEntryPointInfo::GetDecrLoopCountPerBailout();
        local_a8 = uVar9 * (bVar4 - 1);
        puVar13 = min<unsigned_int>(&local_a8,&this_02->totalJittedLoopIterations);
        this_02->totalJittedLoopIterations = *puVar13 & 0xff;
        this_02->jittedLoopIterationsSinceLastBailout = 0;
      }
      ByteCodeReader::SetCurrentOffset((ByteCodeReader *)this,autoRestore._12_4_);
      return this_01;
    }
    this_01->interpretCount = this_01->interpretCount + 1;
    return this_01;
  }
  this_01->interpretCount = (uint)((isFirstIteration ^ 0xffU) & 1) + this_01->interpretCount;
  pFVar14 = GetFunctionBody(this);
  uVar5 = FunctionBody::GetLoopInterpretCount(pFVar14,this_01);
  if (uVar5 < this_01->interpretCount) {
    this_04 = ScriptContext::GetConfig(*(ScriptContext **)(this + 0x78));
    bVar3 = ScriptConfiguration::IsNoNative(this_04);
    if (bVar3) {
      return (LoopHeader *)0x0;
    }
    bVar3 = FunctionBody::DoJITLoopBody(this_00);
    if ((!bVar3) || ((this_01->hasYield & 1U) != 0)) {
      return (LoopHeader *)0x0;
    }
    if ((this_02 != (LoopEntryPointInfo *)0x0) &&
       (bVar3 = EntryPointInfo::IsNotScheduled(&this_02->super_EntryPointInfo), bVar3)) {
      pNVar15 = ScriptContext::GetNativeCodeGenerator(*(ScriptContext **)(this + 0x78));
      RVar10 = FunctionBody::GetLocalsCount(this_00);
      GenerateLoopBody(pNVar15,this_00,this_01,&this_02->super_EntryPointInfo,RVar10,
                       (Var *)(this + 0x160));
    }
  }
  else if (((doProfileLoopCheck) && (((byte)this[0xd6] >> 4 & 1) != 0)) &&
          (uVar9 = this_01->interpretCount,
          uVar5 = FunctionBody::GetLoopProfileThreshold(this_00,uVar5), uVar5 < uVar9)) {
    if (((byte)this[0xd6] >> 3 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1890,"(!switchProfileMode)","!switchProfileMode");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    this[0xd6] = (InterpreterStackFrame)((byte)this[0xd6] & 0xf7 | 8);
    if (*(int *)(this + 0xd8) != -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1892,"(switchProfileModeOnLoopEndNumber == 0u - 1)",
                                  "switchProfileModeOnLoopEndNumber == 0u - 1");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    *(uint32 *)(this + 0xd8) = loopNumber;
  }
  return (LoopHeader *)0x0;
}

Assistant:

LoopHeader const * InterpreterStackFrame::DoLoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, const bool doProfileLoopCheck, const bool isFirstIteration)
    {
#if ENABLE_PROFILE_INFO
        class AutoRestoreLoopNumbers
        {
        private:
            InterpreterStackFrame * const interpreterStackFrame;
            uint32 loopNumber;
            bool doProfileLoopCheck;

        public:
            AutoRestoreLoopNumbers(InterpreterStackFrame *const interpreterStackFrame, uint32 loopNumber, bool doProfileLoopCheck)
                : interpreterStackFrame(interpreterStackFrame), loopNumber(loopNumber), doProfileLoopCheck(doProfileLoopCheck)
            {
                Assert(interpreterStackFrame->currentLoopNum == LoopHeader::NoLoop);
                interpreterStackFrame->currentLoopNum = loopNumber;
                interpreterStackFrame->m_functionBody->SetRecentlyBailedOutOfJittedLoopBody(false);
            }

            ~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }
        };
#endif

        Js::FunctionBody* fn = this->m_functionBody;

        Assert(loopNumber < fn->GetLoopCount());
        Assert(!this->IsInCatchOrFinallyBlock());

        Js::LoopHeader *loopHeader = fn->GetLoopHeader(loopNumber);
        loopHeader->isInTry = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryBlock);
        loopHeader->isInTryFinally = this->TestFlags(Js::InterpreterStackFrameFlags_WithinTryFinallyBlock);

        Js::LoopEntryPointInfo * entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

        if (fn->ForceJITLoopBody() && loopHeader->interpretCount == 0 && loopHeader->hasYield == false &&
            (entryPointInfo != NULL && entryPointInfo->IsNotScheduled()))
        {
#if ENABLE_PROFILE_INFO
            if (Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))
            {
                scriptContext->GetThreadContext()->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);
            }
#endif

#if ENABLE_NATIVE_CODEGEN
            GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
#endif
        }

#if ENABLE_NATIVE_CODEGEN
        // If we have JITted the loop, call the JITted code
        if (entryPointInfo != NULL && entryPointInfo->IsCodeGenDone())
        {
#if DBG_DUMP
            if (PHASE_TRACE1(Js::JITLoopBodyPhase) && CONFIG_FLAG(Verbose))
            {
                fn->DumpFunctionId(true);
                Output::Print(_u(": %-20s LoopBody Execute  Loop: %2d\n"), fn->GetDisplayName(), loopNumber);
                Output::Flush();
            }
            loopHeader->nativeCount++;
#endif
#ifdef BGJIT_STATS
            entryPointInfo->MarkAsUsed();
#endif

            entryPointInfo->EnsureIsReadyToCall();
            entryPointInfo->SetNativeEntryPointProcessed();

            RegSlot envReg = this->m_functionBody->GetEnvRegister();
            if (envReg != Constants::NoRegister)
            {
                this->SetNonVarReg(envReg, this->LdEnv());
            }

            RegSlot localClosureReg = this->m_functionBody->GetLocalClosureRegister();
            RegSlot localFrameDisplayReg = this->m_functionBody->GetLocalFrameDisplayRegister();
            RegSlot paramClosureReg = this->m_functionBody->GetParamClosureRegister();

            if (entryPointInfo->HasJittedStackClosure())
            {
                // The jitted code is expecting the closure registers to point to known stack locations where
                // the closures can be found and possibly boxed.
                // In a jitted loop body, those locations are the local closure fields on the interpreter instance.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, &this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, &this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, &this->paramClosure);
                }
            }
            else
            {
                // In non-stack-closure jitted code, the closure registers are expected to hold the addresses
                // of the actual structures.
                if (localClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localClosureReg, this->localClosure);
                }

                if (localFrameDisplayReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(localFrameDisplayReg, this->localFrameDisplay);
                }

                if (paramClosureReg != Constants::NoRegister)
                {
                    this->SetNonVarReg(paramClosureReg, this->paramClosure);
                }
            }

            uint32 innerScopeCount = this->m_functionBody->GetInnerScopeCount();
            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // As with the function-level scope, transfer the inner scopes from the interpreter's side storage
                // to their dedicated register slots.
                SetNonVarReg(this->m_functionBody->GetFirstInnerScopeRegister() + i, InnerScopeFromIndex(i));
            }

            uint newOffset = 0;
            if (fn->GetIsAsmJsFunction())
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallAsmJsLoopBody(entryPointInfo->jsMethod);
            }
            else
            {
                AutoRestoreLoopNumbers autoRestore(this, loopNumber, doProfileLoopCheck);
                newOffset = this->CallLoopBody(entryPointInfo->jsMethod);
            }

            if (envReg != Constants::NoRegister)
            {
                SetNonVarReg(envReg, nullptr);
            }

            if (localClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(localClosureReg, nullptr);
            }

            if (localFrameDisplayReg != Constants::NoRegister)
            {
                SetNonVarReg(localFrameDisplayReg, nullptr);
            }

            if (paramClosureReg != Constants::NoRegister)
            {
                SetNonVarReg(paramClosureReg, nullptr);
            }

            for (uint32 i = 0; i < innerScopeCount; i++)
            {
                // Get the (possibly updated) scopes from their registers and put them back in side storage.
                // (Getting the updated values may not be necessary, actually, but it can't hurt.)
                // Then null out the registers.
                RegSlot reg = this->m_functionBody->GetFirstInnerScopeRegister() + i;
                SetInnerScopeFromIndex(i, GetNonVarReg(reg));
                SetNonVarReg(reg, nullptr);
            }

            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::ProfiledLoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::GetOpCodeLayout(OpCode::LoopBodyStart) == Js::OpLayoutType::Unsigned1);
            Assert(Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize) == Js::OpCodeUtil::EncodedSize(Js::OpCode::ProfiledLoopBodyStart, layoutSize));
            uint byteCodeSize = Js::OpCodeUtil::EncodedSize(Js::OpCode::LoopBodyStart, layoutSize);
            if (layoutSize == SmallLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Small);
            }
            else if (layoutSize == MediumLayout)
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Medium);
            }
            else
            {
                byteCodeSize += sizeof(OpLayoutUnsigned1_Large);
            }

            if (newOffset == loopHeader->startOffset || newOffset == m_reader.GetCurrentOffset() - byteCodeSize)
            {
                // If we bail out back the start of the loop, or start of this LoopBodyStart just skip and interpret the loop
                // instead of trying to start the loop body again

                // Increment the interpret count of the loop
                loopHeader->interpretCount++;
            }
            else
            {
                this->CheckIfLoopIsHot(loopHeader->profiledLoopCounter);

                if (newOffset >= loopHeader->endOffset)
                {
                    // Reset the totalJittedLoopIterations for the next invocation of this loop entry point
                    entryPointInfo->totalJittedLoopIterations =
                        static_cast<uint8>(
                            min(
                                static_cast<uint>(static_cast<uint8>(CONFIG_FLAG(MinBailOutsBeforeRejit))) *
                                (Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() - 1),
                                entryPointInfo->totalJittedLoopIterations));
                    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
                }
                m_reader.SetCurrentOffset(newOffset);
            }

            return loopHeader;
        }
#endif

        // Increment the interpret count of the loop
        loopHeader->interpretCount += !isFirstIteration;

        const uint loopInterpretCount = GetFunctionBody()->GetLoopInterpretCount(loopHeader);
        if (loopHeader->interpretCount > loopInterpretCount)
        {
            if (this->scriptContext->GetConfig()->IsNoNative())
            {
                return nullptr;
            }

            if (!fn->DoJITLoopBody() || loopHeader->hasYield)
            {
                return nullptr;
            }

#if ENABLE_NATIVE_CODEGEN
#if ENABLE_OOP_NATIVE_CODEGEN
            // If for some reason OOP JIT isn't connected (e.g. it crashed), don't attempt to JIT a loop body
            if (JITManager::GetJITManager()->IsOOPJITEnabled() && !JITManager::GetJITManager()->IsConnected())
            {
                return nullptr;
            }
#endif
            // If the job is not scheduled then we need to schedule it now.
            // It is possible a job was scheduled earlier and we find ourselves looking at the same entry point
            // again. For example, if the function with the loop was JITed and bailed out then as we finish
            // the call in the interpreter we might encounter a loop for which we had scheduled a JIT job before
            // the function was initially scheduled. In such cases, that old JIT job will complete. If it completes
            // successfully then we can go ahead and use it. If it fails then it will eventually revert to the
            // NotScheduled state. Since transitions from NotScheduled can only occur on the main thread,
            // by checking the state we are safe from racing with the JIT thread when looking at the other fields
            // of the entry point.
            if (entryPointInfo != NULL && entryPointInfo->IsNotScheduled())
            {
                GenerateLoopBody(scriptContext->GetNativeCodeGenerator(), fn, loopHeader, entryPointInfo, fn->GetLocalsCount(), this->m_localSlots);
            }
#endif
        }
#if ENABLE_PROFILE_INFO
        else if (
            doProfileLoopCheck &&
            isAutoProfiling &&
            loopHeader->interpretCount > fn->GetLoopProfileThreshold(loopInterpretCount))
        {
            // Start profiling the loop so that the jitted loop body will have some profile data to use
            Assert(!switchProfileMode);
            switchProfileMode = true;
            Assert(switchProfileModeOnLoopEndNumber == 0u - 1);
            switchProfileModeOnLoopEndNumber = loopNumber;
        }
#endif

        return nullptr;
    }